

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_ping.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined1 local_e0 [7];
  bool ok;
  result_t ping_result;
  dev_ping p;
  int opt;
  string local_40 [3];
  bool fragmentation;
  uint32_t packetsize;
  string addr;
  char *short_options;
  char **argv_local;
  int argc_local;
  
  printf("Ping device:\n");
  if (argc < 2) {
    display_usage();
    argv_local._4_4_ = -1;
  }
  else {
    std::__cxx11::string::string(local_40);
    opt = 0;
    do {
      iVar2 = getopt(argc,argv,"hs:f");
      if (iVar2 == 0x66) {
        printf("\t fragmentation off by default (TODO)\n");
      }
      else {
        if (iVar2 == 0x68) {
          display_usage();
          argv_local._4_4_ = 0;
          goto LAB_00104781;
        }
        if (iVar2 == 0x73) {
          if (_optarg != 0) {
            __isoc99_sscanf(_optarg,"%u",&opt);
            printf("\t packetsize %u\n",(ulong)(uint)opt);
          }
        }
        else {
          printf("\t ping \'%s\'\n",argv[_optind]);
          std::__cxx11::string::assign((char *)local_40);
        }
      }
    } while (iVar2 != -1);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      dev_ping::dev_ping((dev_ping *)&ping_result.field_0x48);
      dev_ping::result_s::result_s((result_s *)local_e0);
      if (opt != 0) {
        dev_ping::setSize((dev_ping *)&ping_result.field_0x48,(uint16_t)opt);
      }
      bVar1 = dev_ping::check((dev_ping *)&ping_result.field_0x48,(string *)local_40,
                              (result_t *)local_e0);
      pcVar5 = "fail";
      if (bVar1) {
        pcVar5 = "ok";
      }
      printf("Ping: %s\n",pcVar5);
      uVar4 = std::__cxx11::string::c_str();
      printf("%s",uVar4);
      argv_local._4_4_ = 0;
      dev_ping::result_s::~result_s((result_s *)local_e0);
      dev_ping::~dev_ping((dev_ping *)&ping_result.field_0x48);
    }
    else {
      argv_local._4_4_ = -2;
    }
LAB_00104781:
    std::__cxx11::string::~string(local_40);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
//    setbuf(stdout, NULL); // TODO: remove, need only for debug on cross gdb
    printf("Ping device:\n");

    if (argc < 2) {
        display_usage();
        return -1;
    }
    const char *short_options = {"hs:f"}; // x: - mean x have parametr

    std::string addr;
    uint32_t packetsize = 0;
    bool fragmentation = false;

    int opt;
    do {
        opt = getopt(argc, argv, short_options);
        switch (opt) {
            case 'h': {
                display_usage();
                return 0;
            } break;

            case 's': {
                if (optarg) {
                    sscanf(optarg, "%u", &packetsize);
                    printf("\t packetsize %u\n", packetsize);
                }
            } break;

            case 'f': {
                printf("\t fragmentation off by default (TODO)\n");
            } break;

            default: {
                printf("\t ping '%s'\n", argv[optind]);
                addr.assign(argv[optind]);
            } break;
        }
    } while (opt != -1);

    if (addr.empty()) return -2;

    dev_ping p;
    dev_ping::result_t ping_result;
    if (packetsize) p.setSize(packetsize);
    bool ok = p.check(addr, &ping_result);
    printf("Ping: %s\n", ok ? "ok" : "fail");
    printf("%s", ping_result.status.c_str());

    return 0;
}